

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O0

bool IsChildWithParentsTree(Package *package)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var4;
  _Node_iterator_base<uint256,_true> this;
  long in_FS_OFFSET;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  iVar5;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  iVar6;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  parent_txids;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *in_stack_ffffffffffffff08;
  _Node_iterator_base<uint256,_true> __pred;
  bool local_61;
  _Hash_node_base in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsChildWithParents((Package *)in_stack_ffffffffffffffb0._M_nxt);
  if (bVar2) {
    __pred._M_cur = (__node_type *)&stack0xffffffffffffffb0;
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::unordered_set(in_stack_fffffffffffffef8);
    cVar3 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT17(in_stack_ffffffffffffff07,
                       CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    _Var4 = __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
            ::operator-((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                         *)in_stack_ffffffffffffff08,
                        CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::end((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
           *)CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    iVar5 = std::
            inserter<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
                      (in_stack_ffffffffffffff08,
                       (__range_iter_t<std::unordered_set<uint256,_SaltedTxidHasher>_>)__pred._M_cur
                      );
    iVar6 = std::
            transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,std::insert_iterator<std::unordered_set<uint256,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<uint256>>>,IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__0>
                      (cVar3._M_current,_Var4._M_current,iVar5.container,
                       iVar5.iter.super__Node_iterator_base<uint256,_true>._M_cur.
                       super__Node_iterator_base<uint256,_true>);
    this._M_cur = (__node_type *)iVar6.iter.super__Node_iterator_base<uint256,_true>._M_cur;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT17(in_stack_ffffffffffffff07,
                         CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT17(in_stack_ffffffffffffff07,
                       CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator-((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)this._M_cur,
                CONCAT17(in_stack_ffffffffffffff07,
                         CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    local_61 = std::
               all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                         ((shared_ptr<const_CTransaction> *)iVar5.container,
                          (shared_ptr<const_CTransaction> *)
                          iVar5.iter.super__Node_iterator_base<uint256,_true>._M_cur,
                          (anon_class_8_1_746bebdd)__pred._M_cur);
    std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
    ::~unordered_set(in_stack_fffffffffffffef8);
  }
  else {
    local_61 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool IsChildWithParentsTree(const Package& package)
{
    if (!IsChildWithParents(package)) return false;
    std::unordered_set<uint256, SaltedTxidHasher> parent_txids;
    std::transform(package.cbegin(), package.cend() - 1, std::inserter(parent_txids, parent_txids.end()),
                   [](const auto& ptx) { return ptx->GetHash(); });
    // Each parent must not have an input who is one of the other parents.
    return std::all_of(package.cbegin(), package.cend() - 1, [&](const auto& ptx) {
        for (const auto& input : ptx->vin) {
            if (parent_txids.count(input.prevout.hash) > 0) return false;
        }
        return true;
    });
}